

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O0

void __thiscall Centaurus::Stage1Runner::~Stage1Runner(Stage1Runner *this)

{
  Stage1Runner *this_local;
  
  (this->super_BaseRunner).super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__Stage1Runner_00312178;
  BaseRunner::close_semaphore(&this->super_BaseRunner,true);
  BaseRunner::release_memory(&this->super_BaseRunner,true);
  std::
  vector<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
  ::~vector(&this->result_chunks_);
  BaseRunner::~BaseRunner(&this->super_BaseRunner);
  return;
}

Assistant:

virtual ~Stage1Runner() {
    close_semaphore(true);
    release_memory(true);
  }